

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
CP::vector<std::pair<int,_int>_>::expand(vector<std::pair<int,_int>_> *this,size_t capacity)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  pair<int,_int> *ppVar3;
  pair<int,_int> *local_60;
  ulong local_38;
  size_t i;
  pair<int,_int> *arr;
  size_t capacity_local;
  vector<std::pair<int,_int>_> *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = capacity;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  ppVar3 = (pair<int,_int> *)operator_new__(uVar2);
  if (capacity != 0) {
    local_60 = ppVar3;
    do {
      std::pair<int,_int>::pair<int,_int,_true>(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != ppVar3 + capacity);
  }
  for (local_38 = 0; local_38 < this->mSize; local_38 = local_38 + 1) {
    std::pair<int,_int>::operator=(ppVar3 + local_38,this->mData + local_38);
  }
  if (this->mData != (pair<int,_int> *)0x0) {
    operator_delete__(this->mData);
  }
  this->mData = ppVar3;
  this->mCap = capacity;
  return;
}

Assistant:

void expand(size_t capacity) {
      T *arr = new T[capacity]();
      for (size_t i = 0;i < mSize;i++) {
        arr[i] = mData[i];
      }
      delete [] mData;
      mData = arr;
      mCap = capacity;
    }